

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O2

void __thiscall QAbstractTestLogger::outputString(QAbstractTestLogger *this,char *msg)

{
  size_t sVar1;
  QAbstractTestLogger *__dest;
  QAbstractTestLogger *this_00;
  
  if (this->stream == (FILE *)0x0) {
    qt_assert("stream",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstracttestlogger.cpp"
              ,0xc6);
  }
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    __dest = (QAbstractTestLogger *)operator_new__(sVar1 + 1);
    this_00 = __dest;
    strcpy((char *)__dest,msg);
    filterUnprintable(this_00,(char *)__dest);
    fputs((char *)__dest,(FILE *)this->stream);
    fflush((FILE *)this->stream);
    operator_delete__(__dest);
    return;
  }
  qt_assert("msg",
            "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstracttestlogger.cpp"
            ,199);
}

Assistant:

void QAbstractTestLogger::outputString(const char *msg)
{
    QTEST_ASSERT(stream);
    QTEST_ASSERT(msg);

    char *filtered = new char[strlen(msg) + 1];
    strcpy(filtered, msg);
    filterUnprintable(filtered);

    ::fputs(filtered, stream);
    ::fflush(stream);

    delete [] filtered;
}